

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::ColoredWriteToStderrOrStdout
               (FILE *output,LogSeverity severity,char *message,size_t len)

{
  bool *pbVar1;
  char *pcVar2;
  bool bVar3;
  GLogColor local_34;
  GLogColor color;
  bool is_stdout;
  size_t len_local;
  char *message_local;
  LogSeverity severity_local;
  FILE *output_local;
  
  bVar3 = output == _stdout;
  pbVar1 = LogDestination::terminal_supports_color();
  if (((*pbVar1 & 1U) == 0) ||
     (((bVar3 || ((fLB::FLAGS_colorlogtostderr & 1) == 0)) &&
      ((!bVar3 || ((fLB::FLAGS_colorlogtostdout & 1) == 0)))))) {
    local_34 = COLOR_DEFAULT;
  }
  else {
    local_34 = SeverityToColor(severity);
  }
  if (local_34 == COLOR_DEFAULT) {
    fwrite(message,len,1,(FILE *)output);
  }
  else {
    pcVar2 = GetAnsiColorCode(local_34);
    fprintf((FILE *)output,"\x1b[0;3%sm",pcVar2);
    fwrite(message,len,1,(FILE *)output);
    fprintf((FILE *)output,"\x1b[m");
  }
  return;
}

Assistant:

static void ColoredWriteToStderrOrStdout(FILE* output, LogSeverity severity,
                                         const char* message, size_t len) {
  bool is_stdout = (output == stdout);
  const GLogColor color = (LogDestination::terminal_supports_color() &&
                           ((!is_stdout && FLAGS_colorlogtostderr) ||
                            (is_stdout && FLAGS_colorlogtostdout)))
                              ? SeverityToColor(severity)
                              : COLOR_DEFAULT;

  // Avoid using cerr from this module since we may get called during
  // exit code, and cerr may be partially or fully destroyed by then.
  if (COLOR_DEFAULT == color) {
    fwrite(message, len, 1, output);
    return;
  }
#ifdef GLOG_OS_WINDOWS
  const HANDLE output_handle =
      GetStdHandle(is_stdout ? STD_OUTPUT_HANDLE : STD_ERROR_HANDLE);

  // Gets the current text color.
  CONSOLE_SCREEN_BUFFER_INFO buffer_info;
  GetConsoleScreenBufferInfo(output_handle, &buffer_info);
  const WORD old_color_attrs = buffer_info.wAttributes;

  // We need to flush the stream buffers into the console before each
  // SetConsoleTextAttribute call lest it affect the text that is already
  // printed but has not yet reached the console.
  fflush(output);
  SetConsoleTextAttribute(output_handle,
                          GetColorAttribute(color) | FOREGROUND_INTENSITY);
  fwrite(message, len, 1, output);
  fflush(output);
  // Restores the text color.
  SetConsoleTextAttribute(output_handle, old_color_attrs);
#else
  fprintf(output, "\033[0;3%sm", GetAnsiColorCode(color));
  fwrite(message, len, 1, output);
  fprintf(output, "\033[m");  // Resets the terminal to default.
#endif  // GLOG_OS_WINDOWS
}